

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvastrscan.c
# Opt level: O3

void nv50_graph_reset(void)

{
  void *pvVar1;
  
  pvVar1 = nva_cards[cnum].bar0;
  *(undefined4 *)((long)pvVar1 + 0x200) = 0xffffefff;
  *(undefined4 *)((long)pvVar1 + 0x200) = 0xffffffff;
  *(undefined4 *)((long)pvVar1 + 0x400040) = 0xffffffff;
  *(undefined4 *)((long)pvVar1 + 0x400040) = 0;
  *(undefined4 *)((long)pvVar1 + 0x400080) = 0x3083c2;
  *(undefined4 *)((long)pvVar1 + 0x400088) = 0x6fe7;
  return;
}

Assistant:

void nv50_graph_reset() {
	nva_wr32(cnum, 0x200, 0xffffefff);
	nva_wr32(cnum, 0x200, 0xffffffff);
	nva_wr32(cnum, 0x400040, -1);
	nva_wr32(cnum, 0x400040, 0);
	nva_wr32(cnum, 0x400080, 0x3083c2);
	nva_wr32(cnum, 0x400088, 0x6fe7);
}